

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

uint32_t helper_add_b(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2)

{
  undefined4 in_ECX;
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar6._4_4_ = r1;
  auVar6._0_4_ = r1;
  auVar6._8_4_ = r1;
  auVar6._12_4_ = r1;
  auVar5._4_4_ = r2;
  auVar5._0_4_ = r2;
  auVar5._8_4_ = r2;
  auVar5._12_4_ = r2;
  auVar10._8_4_ = 1;
  auVar10._0_8_ = 0x1000000010000;
  auVar10._12_4_ = 1;
  auVar3._0_4_ = ((int)(r2 * 0x1000000) >> 0x18) + ((int)(r1 * 0x1000000) >> 0x18);
  auVar3._4_4_ = ((int)(r2 * 0x10000) >> 0x18) + ((int)(r1 * 0x10000) >> 0x18);
  auVar3._8_4_ = ((int)((auVar5._8_8_ & 0xffffffff) * 0x100) >> 0x18) +
                 ((int)((auVar6._8_8_ & 0xffffffff) * 0x100) >> 0x18);
  auVar3._12_4_ = ((int)((auVar10._8_8_ & 0xffffffff) * (ulong)r2) >> 0x18) + ((int)r1 >> 0x18);
  auVar6 = _DAT_00d60a50 & auVar3;
  auVar8._8_4_ = 0x1000000;
  auVar8._0_8_ = 0x10000000100;
  auVar8._12_4_ = 0x1000000;
  auVar9._4_4_ = auVar3._4_4_ * 2;
  auVar9._0_4_ = auVar3._0_4_ * 2;
  auVar9._8_4_ = auVar3._8_4_ * 2;
  auVar9._12_4_ = auVar3._12_4_ * 2;
  auVar9 = auVar9 ^ auVar3;
  auVar7._0_8_ = auVar9._8_8_;
  auVar7._8_4_ = auVar9._8_4_;
  auVar7._12_4_ = auVar9._12_4_;
  auVar4._0_4_ = -(uint)(0x7ffffeff < (int)(auVar3._0_4_ - 0x80U ^ 0x80000000));
  auVar4._4_4_ = -(uint)(0x7ffffeff < (int)(auVar3._4_4_ - 0x80U ^ 0x80000000));
  auVar4._8_4_ = -(uint)(0x7ffffeff < (int)(auVar3._8_4_ - 0x80U ^ 0x80000000));
  auVar4._12_4_ = -(uint)(0x7ffffeff < (int)(auVar3._12_4_ - 0x80U ^ 0x80000000));
  iVar1 = movmskps(in_ECX,auVar4);
  uVar2 = (uint)(iVar1 != 0xf) << 0x1f;
  env->PSW_USB_V = uVar2;
  env->PSW_USB_SV = env->PSW_USB_SV | uVar2;
  uVar2 = (SUB164(auVar7 | auVar9,4) | SUB164(auVar7 | auVar9,0)) << 0x18;
  env->PSW_USB_AV = uVar2;
  env->PSW_USB_SAV = env->PSW_USB_SAV | uVar2;
  return (uint)((auVar8._8_8_ & 0xffffffff) * (ulong)auVar6._12_4_) | auVar6._4_4_ * 0x100 |
         (uint)((auVar6._8_8_ & 0xffffffff) * 0x10000) | auVar6._0_4_;
}

Assistant:

uint32_t helper_add_b(CPUTriCoreState *env, target_ulong r1, target_ulong r2)
{
    int32_t b, i;
    int32_t extr_r1, extr_r2;
    int32_t ovf = 0;
    int32_t avf = 0;
    uint32_t ret = 0;

    for (i = 0; i < 4; i++) {
        extr_r1 = sextract32(r1, i * 8, 8);
        extr_r2 = sextract32(r2, i * 8, 8);

        b = extr_r1 + extr_r2;
        ovf |= ((b > 0x7f) || (b < -0x80));
        avf |= b ^ b * 2u;
        ret |= ((b & 0xff) << (i*8));
    }

    env->PSW_USB_V = (ovf << 31);
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 24;
    env->PSW_USB_SAV |= env->PSW_USB_AV;

    return ret;
}